

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O2

int __thiscall
CCharmapToUniASCII::mapchar(CCharmapToUniASCII *this,wchar_t *ch,char **p,size_t *len)

{
  byte bVar1;
  byte *pbVar2;
  wchar_t wVar3;
  
  if (*len != 0) {
    pbVar2 = (byte *)*p;
    *p = (char *)(pbVar2 + 1);
    bVar1 = *pbVar2;
    wVar3 = L'�';
    if (-1 < (char)bVar1) {
      wVar3 = (uint)bVar1;
    }
    *ch = wVar3;
    *len = *len - 1;
    return 1;
  }
  return 0;
}

Assistant:

virtual int mapchar(wchar_t &ch, const char *&p, size_t &len)
    {
        if (len >= 1)
        {
            /* map the character */
            ch = (unsigned char)*p++;

            /* substitude U+FFFD for any invalid character */
            if (ch > 127)
                ch = 0xFFFD;

            /* deduct it from the length */
            len -= 1;

            /* success */
            return TRUE;
        }
        else
            return FALSE;
    }